

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

void opj_tcd_makelayer(opj_tcd_t *tcd,OPJ_UINT32 layno,OPJ_FLOAT64 thresh,OPJ_UINT32 final)

{
  opj_tcd_tile_t *poVar1;
  opj_tcd_tilecomp_t *poVar2;
  opj_tcd_resolution_t *poVar3;
  opj_tcd_precinct_t *poVar4;
  OPJ_BOOL OVar5;
  opj_tcd_cblk_enc_t *poVar6;
  opj_tcd_layer_t *poVar7;
  opj_tcd_pass_t *poVar8;
  opj_tcd_pass_t *pass;
  OPJ_FLOAT64 dd;
  OPJ_UINT32 dr;
  OPJ_UINT32 n;
  opj_tcd_layer_t *layer;
  opj_tcd_cblk_enc_t *cblk;
  opj_tcd_precinct_t *prc;
  opj_tcd_band_t *band;
  opj_tcd_resolution_t *res;
  opj_tcd_tilecomp_t *tilec;
  opj_tcd_tile_t *tcd_tile;
  uint local_38;
  OPJ_UINT32 passno;
  OPJ_UINT32 cblkno;
  OPJ_UINT32 precno;
  OPJ_UINT32 bandno;
  OPJ_UINT32 resno;
  OPJ_UINT32 compno;
  OPJ_UINT32 final_local;
  OPJ_FLOAT64 thresh_local;
  OPJ_UINT32 layno_local;
  opj_tcd_t *tcd_local;
  
  poVar1 = tcd->tcd_image->tiles;
  poVar1->distolayer[layno] = 0.0;
  for (bandno = 0; bandno < poVar1->numcomps; bandno = bandno + 1) {
    poVar2 = poVar1->comps;
    for (precno = 0; precno < poVar2[bandno].numresolutions; precno = precno + 1) {
      poVar3 = poVar2[bandno].resolutions;
      for (cblkno = 0; cblkno < poVar3[precno].numbands; cblkno = cblkno + 1) {
        OVar5 = opj_tcd_is_band_empty(poVar3[precno].bands + cblkno);
        if (OVar5 == 0) {
          for (passno = 0; passno < poVar3[precno].pw * poVar3[precno].ph; passno = passno + 1) {
            poVar4 = poVar3[precno].bands[cblkno].precincts;
            for (local_38 = 0; local_38 < poVar4[passno].cw * poVar4[passno].ch;
                local_38 = local_38 + 1) {
              poVar6 = poVar4[passno].cblks.enc + local_38;
              poVar7 = poVar6->layers + layno;
              if (layno == 0) {
                poVar6->numpassesinlayers = 0;
              }
              dd._4_4_ = poVar6->numpassesinlayers;
              if (0.0 <= (double)thresh) {
                for (tcd_tile._4_4_ = poVar6->numpassesinlayers;
                    tcd_tile._4_4_ < poVar6->totalpasses; tcd_tile._4_4_ = tcd_tile._4_4_ + 1) {
                  poVar8 = poVar6->passes + tcd_tile._4_4_;
                  if (dd._4_4_ == 0) {
                    dd._0_4_ = poVar8->rate;
                    pass = (opj_tcd_pass_t *)poVar8->distortiondec;
                  }
                  else {
                    dd._0_4_ = poVar8->rate - poVar6->passes[dd._4_4_ - 1].rate;
                    pass = (opj_tcd_pass_t *)
                           ((double)poVar8->distortiondec -
                           (double)poVar6->passes[dd._4_4_ - 1].distortiondec);
                  }
                  if (dd._0_4_ == 0) {
                    if (((double)pass != 0.0) || (NAN((double)pass))) {
                      dd._4_4_ = tcd_tile._4_4_ + 1;
                    }
                  }
                  else if ((double)thresh - (double)pass / (double)dd._0_4_ < 2.220446049250313e-16)
                  {
                    dd._4_4_ = tcd_tile._4_4_ + 1;
                  }
                }
              }
              else {
                dd._4_4_ = poVar6->totalpasses;
              }
              poVar7->numpasses = dd._4_4_ - poVar6->numpassesinlayers;
              if (poVar7->numpasses == 0) {
                poVar7->disto = 0.0;
              }
              else {
                if (poVar6->numpassesinlayers == 0) {
                  poVar7->len = poVar6->passes[dd._4_4_ - 1].rate;
                  poVar7->data = poVar6->data;
                  poVar7->disto = poVar6->passes[dd._4_4_ - 1].distortiondec;
                }
                else {
                  poVar7->len = poVar6->passes[dd._4_4_ - 1].rate -
                                poVar6->passes[poVar6->numpassesinlayers - 1].rate;
                  poVar7->data = poVar6->data + poVar6->passes[poVar6->numpassesinlayers - 1].rate;
                  poVar7->disto =
                       (OPJ_FLOAT64)
                       ((double)poVar6->passes[dd._4_4_ - 1].distortiondec -
                       (double)poVar6->passes[poVar6->numpassesinlayers - 1].distortiondec);
                }
                poVar1->distolayer[layno] =
                     (OPJ_FLOAT64)((double)poVar7->disto + (double)poVar1->distolayer[layno]);
                if (final != 0) {
                  poVar6->numpassesinlayers = dd._4_4_;
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void opj_tcd_makelayer(opj_tcd_t *tcd,
                       OPJ_UINT32 layno,
                       OPJ_FLOAT64 thresh,
                       OPJ_UINT32 final)
{
    OPJ_UINT32 compno, resno, bandno, precno, cblkno;
    OPJ_UINT32 passno;

    opj_tcd_tile_t *tcd_tile = tcd->tcd_image->tiles;

    tcd_tile->distolayer[layno] = 0;        /* fixed_quality */

    for (compno = 0; compno < tcd_tile->numcomps; compno++) {
        opj_tcd_tilecomp_t *tilec = &tcd_tile->comps[compno];

        for (resno = 0; resno < tilec->numresolutions; resno++) {
            opj_tcd_resolution_t *res = &tilec->resolutions[resno];

            for (bandno = 0; bandno < res->numbands; bandno++) {
                opj_tcd_band_t *band = &res->bands[bandno];

                /* Skip empty bands */
                if (opj_tcd_is_band_empty(band)) {
                    continue;
                }

                for (precno = 0; precno < res->pw * res->ph; precno++) {
                    opj_tcd_precinct_t *prc = &band->precincts[precno];

                    for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
                        opj_tcd_cblk_enc_t *cblk = &prc->cblks.enc[cblkno];
                        opj_tcd_layer_t *layer = &cblk->layers[layno];
                        OPJ_UINT32 n;

                        if (layno == 0) {
                            cblk->numpassesinlayers = 0;
                        }

                        n = cblk->numpassesinlayers;

                        if (thresh < 0) {
                            /* Special value to indicate to use all passes */
                            n = cblk->totalpasses;
                        } else {
                            for (passno = cblk->numpassesinlayers; passno < cblk->totalpasses; passno++) {
                                OPJ_UINT32 dr;
                                OPJ_FLOAT64 dd;
                                opj_tcd_pass_t *pass = &cblk->passes[passno];

                                if (n == 0) {
                                    dr = pass->rate;
                                    dd = pass->distortiondec;
                                } else {
                                    dr = pass->rate - cblk->passes[n - 1].rate;
                                    dd = pass->distortiondec - cblk->passes[n - 1].distortiondec;
                                }

                                if (!dr) {
                                    if (dd != 0) {
                                        n = passno + 1;
                                    }
                                    continue;
                                }
                                if (thresh - (dd / dr) <
                                        DBL_EPSILON) { /* do not rely on float equality, check with DBL_EPSILON margin */
                                    n = passno + 1;
                                }
                            }
                        }

                        layer->numpasses = n - cblk->numpassesinlayers;

                        if (!layer->numpasses) {
                            layer->disto = 0;
                            continue;
                        }

                        if (cblk->numpassesinlayers == 0) {
                            layer->len = cblk->passes[n - 1].rate;
                            layer->data = cblk->data;
                            layer->disto = cblk->passes[n - 1].distortiondec;
                        } else {
                            layer->len = cblk->passes[n - 1].rate - cblk->passes[cblk->numpassesinlayers -
                                         1].rate;
                            layer->data = cblk->data + cblk->passes[cblk->numpassesinlayers - 1].rate;
                            layer->disto = cblk->passes[n - 1].distortiondec -
                                           cblk->passes[cblk->numpassesinlayers - 1].distortiondec;
                        }

                        tcd_tile->distolayer[layno] += layer->disto;    /* fixed_quality */

                        if (final) {
                            cblk->numpassesinlayers = n;
                        }
                    }
                }
            }
        }
    }
}